

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall Js::PathTypeHandlerBase::LockInlineSlotCapacity(PathTypeHandlerBase *this)

{
  PathTypeSuccessorInfo *pPVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x9ef,"(!GetIsInlineSlotCapacityLocked())",
                                "!GetIsInlineSlotCapacityLocked()");
    if (!bVar4) goto LAB_00dd3104;
    *puVar5 = 0;
  }
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  pPVar1 = (this->successorInfo).ptr;
  if (pPVar1 != (PathTypeSuccessorInfo *)0x0) {
    if (pPVar1->kind == PathTypeSuccessorKindSingle) {
      if ((*(long **)(pPVar1 + 0x10) != (long *)0x0) &&
         (lVar2 = **(long **)(pPVar1 + 0x10), lVar2 != 0)) {
        (**(code **)(**(long **)(lVar2 + 0x28) + 0x1f0))();
        return;
      }
    }
    else {
      if (*(long *)(pPVar1 + 8) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xdf,"(this->propertySuccessors)","this->propertySuccessors");
        if (!bVar4) {
LAB_00dd3104:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      lVar2 = *(long *)(pPVar1 + 8);
      if (*(int *)(lVar2 + 0x24) != 0) {
        uVar7 = 0;
        do {
          iVar8 = *(int *)(*(long *)(lVar2 + 8) + uVar7 * 4);
          while (iVar8 != -1) {
            lVar6 = (long)iVar8;
            iVar8 = *(int *)(*(long *)(lVar2 + 0x10) + 8 + lVar6 * 0x18);
            lVar6 = **(long **)(*(long *)(lVar2 + 0x10) + lVar6 * 0x18);
            if (lVar6 != 0) {
              (**(code **)(**(long **)(lVar6 + 0x28) + 0x1f0))();
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < *(uint *)(lVar2 + 0x24));
      }
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::LockInlineSlotCapacity()
    {
        Assert(!GetIsInlineSlotCapacityLocked());
        SetIsInlineSlotCapacityLocked();

        this->MapSuccessors([](const PathTypeSuccessorKey, RecyclerWeakReference<DynamicType>* typeWeakReference)
        {
            DynamicType * type = typeWeakReference->Get();
            if (!type)
            {
                return;
            }

            type->GetTypeHandler()->LockInlineSlotCapacity();
        });
    }